

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlglClose(void)

{
  RenderBatch batch;
  undefined8 unaff_RBP;
  
  batch.vertexBuffer = (VertexBuffer *)RLGL.defaultBatch.draws;
  batch._0_8_ = RLGL.defaultBatch.vertexBuffer;
  batch.draws = (DrawCall *)RLGL.defaultBatch._24_8_;
  batch._24_8_ = unaff_RBP;
  rlUnloadRenderBatch(batch);
  rlUnloadShaderDefault();
  (*glad_glDeleteTextures)(1,(GLuint *)0x1f1d40);
  TraceLog(3,"TEXTURE: [ID %i] Default texture unloaded successfully",
           (ulong)RLGL.State.defaultTextureId);
  return;
}

Assistant:

void rlglClose(void)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    rlUnloadRenderBatch(RLGL.defaultBatch);

    rlUnloadShaderDefault();          // Unload default shader

    glDeleteTextures(1, &RLGL.State.defaultTextureId); // Unload default texture
    TRACELOG(LOG_INFO, "TEXTURE: [ID %i] Default texture unloaded successfully", RLGL.State.defaultTextureId);
#endif
}